

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_binder.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::BindCorrelatedColumns
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,ErrorData *error_message)

{
  pointer *pprVar1;
  ExpressionBinder *this_00;
  bool bVar2;
  vector<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
  *__x;
  reference pvVar3;
  idx_t depth;
  vector<std::reference_wrapper<duckdb::ExpressionBinder>,_true> binders;
  type bind_error;
  ErrorData next_error;
  ErrorData local_130;
  ErrorData local_b0;
  
  __x = &Binder::GetActiveBinders(this->binder)->
         super_vector<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
  ;
  ::std::
  vector<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
  ::vector(&binders.
            super_vector<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
           ,__x);
  ErrorData::ErrorData(&bind_error,error_message);
  pprVar1 = &(__x->
             super__Vector_base<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  *pprVar1 = *pprVar1 + -1;
  depth = 1;
  do {
    if ((__x->
        super__Vector_base<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (__x->
        super__Vector_base<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) break;
    pvVar3 = vector<std::reference_wrapper<duckdb::ExpressionBinder>,_true>::back
                       ((vector<std::reference_wrapper<duckdb::ExpressionBinder>,_true> *)__x);
    this_00 = pvVar3->_M_data;
    QualifyColumnNames(this_00->binder,expr);
    Bind(&next_error,this_00,expr,depth,false);
    bVar2 = next_error.initialized;
    if (next_error.initialized == false) {
      ErrorData::operator=(&bind_error,&next_error);
    }
    else {
      ErrorData::ErrorData(&local_b0,&next_error);
      CombineErrors(&bind_error,&local_b0);
      ErrorData::~ErrorData(&local_b0);
      depth = depth + 1;
      pprVar1 = &(__x->
                 super__Vector_base<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pprVar1 = *pprVar1 + -1;
    }
    ErrorData::~ErrorData(&next_error);
  } while (bVar2 != false);
  ::std::
  vector<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
  ::operator=(__x,&binders.
                   super_vector<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
             );
  ErrorData::ErrorData(&local_130,&bind_error);
  BindResult::BindResult(__return_storage_ptr__,&local_130);
  ErrorData::~ErrorData(&local_130);
  ErrorData::~ErrorData(&bind_error);
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
                   *)&binders);
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindCorrelatedColumns(unique_ptr<ParsedExpression> &expr, ErrorData error_message) {
	// try to bind in one of the outer queries, if the binding error occurred in a subquery
	auto &active_binders = binder.GetActiveBinders();
	// make a copy of the set of binders, so we can restore it later
	auto binders = active_binders;
	auto bind_error = std::move(error_message);
	// we already failed with the current binder
	active_binders.pop_back();
	idx_t depth = 1;
	while (!active_binders.empty()) {
		auto &next_binder = active_binders.back().get();
		ExpressionBinder::QualifyColumnNames(next_binder.binder, expr);
		auto next_error = next_binder.Bind(expr, depth);
		if (!next_error.HasError()) {
			bind_error = std::move(next_error);
			break;
		}
		CombineErrors(bind_error, std::move(next_error));
		depth++;
		active_binders.pop_back();
	}
	active_binders = binders;
	return BindResult(bind_error);
}